

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void r8poly_print(int n,double *a,string *title)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char cVar7;
  double *pdVar8;
  double dVar9;
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  uVar6 = (ulong)(uint)n;
  if (title->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (n < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = 0\n",0xb);
    return;
  }
  cVar7 = ' ';
  if (a[uVar6] < 0.0) {
    cVar7 = '-';
  }
  dVar9 = ABS(a[uVar6]);
  if ((uint)n < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = ",9);
    if (n != 1) {
      local_36 = cVar7;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_36,1)
      ;
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
      poVar1 = std::ostream::_M_insert<double>(dVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      return;
    }
    local_35 = cVar7;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_35,1);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
    poVar1 = std::ostream::_M_insert<double>(dVar9);
    pcVar5 = " * x\n";
    lVar2 = 5;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = ",9);
    local_34 = cVar7;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_34,1);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
    poVar1 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," * x ^ ",7);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    pcVar5 = "\n";
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar2);
  uVar4 = (ulong)(n - 1);
  pdVar8 = a + uVar4;
  do {
    dVar9 = *pdVar8;
    iVar3 = (int)uVar4;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      cVar7 = (dVar9 < 0.0) * '\x02' + '+';
      dVar9 = ABS(dVar9);
      if (uVar6 < 3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
        if (iVar3 != 1) {
          local_33 = cVar7;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,&local_33,1);
          *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
          poVar1 = std::ostream::_M_insert<double>(dVar9);
          goto LAB_001cb05d;
        }
        local_32 = cVar7;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_32,1);
        *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
        poVar1 = std::ostream::_M_insert<double>(dVar9);
        lVar2 = 5;
        pcVar5 = " * x\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
        local_31 = cVar7;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_31,1);
        *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
        poVar1 = std::ostream::_M_insert<double>(dVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," * x ^ ",7);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
LAB_001cb05d:
        lVar2 = 1;
        pcVar5 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar2);
    }
    pdVar8 = pdVar8 + -1;
    uVar6 = uVar6 - 1;
    uVar4 = (ulong)(iVar3 - 1);
    if (iVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void r8poly_print ( int n, double a[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8POLY_PRINT prints out a polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the dimension of A.
//
//    Input, double A[N+1], the polynomial coefficients.
//    A(0) is the constant term and
//    A(N) is the coefficient of X^N.
//
//    Input, string TITLE, a title.
//
{
  int i;
  double mag;
  char plus_minus;

  if ( 0 < title.length ( ) )
  {
    std::cout << "\n";
    std::cout << title << "\n";
  }
  std::cout << "\n";

  if ( n < 0 )
  {
    std::cout << "  p(x) = 0\n";
    return;
  }

  if ( a[n] < 0.0 )
  {
    plus_minus = '-';
  }
  else
  {
    plus_minus = ' ';
  }

  mag = fabs ( a[n] );

  if ( 2 <= n )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x ^ " << n << "\n";
  }
  else if ( n == 1 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x\n";
  }
  else if ( n == 0 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << "\n";
  }

  for ( i = n - 1; 0 <= i; i-- )
  {
    if ( a[i] < 0.0 )
    {
      plus_minus = '-';
    }
    else
    {
      plus_minus = '+';
    }

    mag = fabs ( a[i] );

    if ( mag != 0.0 )
    {
      if ( 2 <= i )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x ^ " << i << "\n";
      }
      else if ( i == 1 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x\n";
      }
      else if ( i == 0 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << "\n";
      }
    }
  }

  return;
}